

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserNodeInfo * xmlParserFindNodeInfo(xmlParserCtxtPtr ctx,xmlNodePtr node)

{
  xmlParserNodeInfo *pxVar1;
  unsigned_long uVar2;
  
  if (node == (xmlNodePtr)0x0 || ctx == (xmlParserCtxtPtr)0x0) {
    return (xmlParserNodeInfo *)0x0;
  }
  uVar2 = xmlParserFindNodeInfoIndex(&ctx->node_seq,node);
  if (uVar2 < (ctx->node_seq).length) {
    pxVar1 = (ctx->node_seq).buffer;
    if (pxVar1[uVar2].node == node) {
      return pxVar1 + uVar2;
    }
  }
  return (xmlParserNodeInfo *)0x0;
}

Assistant:

const xmlParserNodeInfo *
xmlParserFindNodeInfo(const xmlParserCtxtPtr ctx, const xmlNodePtr node)
{
    unsigned long pos;

    if ((ctx == NULL) || (node == NULL))
        return (NULL);
    /* Find position where node should be at */
    pos = xmlParserFindNodeInfoIndex(&ctx->node_seq, node);
    if (pos < ctx->node_seq.length
        && ctx->node_seq.buffer[pos].node == node)
        return &ctx->node_seq.buffer[pos];
    else
        return NULL;
}